

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall QMimeXMLProvider::ensureLoaded(QMimeXMLProvider *this)

{
  bool bVar1;
  compare_eq_result_container<QList<QString>,_QString> cVar2;
  QMimeXMLProvider *this_00;
  const_iterator o;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar3;
  QString *file;
  add_const_t<QList<QString>_> *__range1_1;
  value_type *entry;
  QDirListing *__range1;
  size_t RuntimeThreshold;
  size_t i;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  sentinel __end1;
  const_iterator __begin1;
  QString packageDir;
  QStringList allFiles;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *in_stack_fffffffffffffe38;
  QMimeAllGlobPatterns *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4c;
  undefined1 in_stack_fffffffffffffe4d;
  char16_t in_stack_fffffffffffffe4e;
  QStringView *in_stack_fffffffffffffe50;
  qsizetype *this_01;
  QString *fileName;
  ulong local_108;
  const_iterator local_e0 [4];
  QString *local_c0;
  char16_t local_b8;
  undefined2 local_ac;
  undefined1 local_a9;
  const_iterator local_a8;
  QDirListing local_a0;
  QString local_98;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QString *local_40;
  char16_t local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x8fd5bb);
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = &(in_RDI->d).size;
  fileName = &local_98;
  this_00 = (QMimeXMLProvider *)std::data<char16_t_const,10ul>((char16_t (*) [10])L"/packages");
  for (local_108 = 0; (local_108 < 10 && (L"/packages"[local_108] != L'\0'));
      local_108 = local_108 + 1) {
  }
  QStringView::QStringView<char16_t,_true>
            (in_stack_fffffffffffffe50,
             (char16_t *)
             CONCAT26(in_stack_fffffffffffffe4e,
                      CONCAT15(in_stack_fffffffffffffe4d,
                               CONCAT14(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))),
             (qsizetype)in_stack_fffffffffffffe40);
  ::operator+((QString *)in_stack_fffffffffffffe40,(QStringView *)in_stack_fffffffffffffe38);
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QString_&,_QStringView> *)in_stack_fffffffffffffe38);
  ::operator|((enum_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
              (enum_type)in_stack_fffffffffffffe40);
  QDirListing::QDirListing
            ((QDirListing *)this_01,(QString *)in_RDI,
             (QFlagsStorageHelper<QDirListing::IteratorFlag,_4>)SUB84((ulong)fileName >> 0x20,0));
  local_a8.dirEntry.dirListPtr = (DirEntry)&DAT_aaaaaaaaaaaaaaaa;
  local_a8 = QDirListing::begin((QDirListing *)in_stack_fffffffffffffe50);
  local_a9 = 0xaa;
  QDirListing::end(&local_a0);
  while (bVar1 = ::operator!=(&local_a8), bVar1) {
    QDirListing::const_iterator::operator*(&local_a8);
    local_ac = 0x2f;
    QVar3 = ::operator+((QString *)
                        CONCAT26(in_stack_fffffffffffffe4e,
                                 CONCAT15(in_stack_fffffffffffffe4d,
                                          CONCAT14(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48))),
                        (char16_t *)in_stack_fffffffffffffe40);
    local_c0 = QVar3.a;
    in_stack_fffffffffffffe4e = QVar3.b;
    local_b8 = in_stack_fffffffffffffe4e;
    local_40 = local_c0;
    local_38 = in_stack_fffffffffffffe4e;
    QDirListing::DirEntry::fileName((DirEntry *)in_stack_fffffffffffffe38);
    ::operator+((QStringBuilder<const_QString_&,_char16_t> *)
                CONCAT26(in_stack_fffffffffffffe4e,
                         CONCAT15(in_stack_fffffffffffffe4d,
                                  CONCAT14(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))),
                (QString *)in_stack_fffffffffffffe40);
    QList<QString>::emplace_back<QStringBuilder<QStringBuilder<QString_const&,char16_t>,QString>>
              ((QList<QString> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *)0x8fd917);
    QString::~QString((QString *)0x8fd924);
    QDirListing::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe38);
  }
  QDirListing::~QDirListing((QDirListing *)in_stack_fffffffffffffe40);
  cVar2 = QList<QString>::operator==((QList<QString> *)this_01,in_RDI);
  if (!cVar2) {
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffe40,
               (QList<QString> *)in_stack_fffffffffffffe38);
    QHash<QString,_QMimeTypeXMLData>::clear
              ((QHash<QString,_QMimeTypeXMLData> *)in_stack_fffffffffffffe40);
    QHash<QString,_QString>::clear((QHash<QString,_QString> *)in_stack_fffffffffffffe40);
    QHash<QString,_QList<QString>_>::clear(&in_stack_fffffffffffffe40->m_fastPatterns);
    QMimeAllGlobPatterns::clear(in_stack_fffffffffffffe40);
    QList<QMimeMagicRuleMatcher>::clear((QList<QMimeMagicRuleMatcher> *)in_stack_fffffffffffffe40);
    local_e0[0].i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_e0[0] = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffe40);
    o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffe40);
    while (bVar1 = QList<QString>::const_iterator::operator!=(local_e0,o), bVar1) {
      QList<QString>::const_iterator::operator*(local_e0);
      load(this_00,fileName);
      QList<QString>::const_iterator::operator++(local_e0);
    }
  }
  QString::~QString((QString *)0x8fdb2b);
  QList<QString>::~QList((QList<QString> *)0x8fdb38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::ensureLoaded()
{
    QStringList allFiles;
    const QString packageDir = m_directory + QStringView(u"/packages");
    for (const auto &entry : QDirListing(packageDir, QDirListing::IteratorFlag::FilesOnly
                                         | QDirListing::IteratorFlag::ResolveSymlinks))
        allFiles.emplace_back(packageDir + u'/' + entry.fileName());

    if (m_allFiles == allFiles)
        return;
    m_allFiles = allFiles;

    m_nameMimeTypeMap.clear();
    m_aliases.clear();
    m_parents.clear();
    m_mimeTypeGlobs.clear();
    m_magicMatchers.clear();

    //qDebug() << "Loading" << m_allFiles;

    for (const QString &file : std::as_const(allFiles))
        load(file);
}